

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O0

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end,int time_now)

{
  int iVar1;
  int length;
  int next_copy_time;
  int next_copy_id;
  int next_copy;
  int next_event_time;
  int next_motion_time;
  int time_now_local;
  int end_local;
  int start_local;
  uint8_t collision_identity_local;
  Ball *object_local;
  TIA *this_local;
  
  next_copy = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.motion_time
              + -0x40;
  time_now_local = start;
  while (time_now_local < end) {
    next_copy_id = end;
    if ((((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving & 1U)
         != 0) && (next_copy < end)) {
      next_copy_id = next_copy;
    }
    next_copy_time = 0xa0;
    length = 0;
    if (object->copy_flags != 0) {
      if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position < 0x10
          ) && ((object->copy_flags & 1U) != 0)) {
        next_copy_time = 0x10;
        length = 1;
      }
      else if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position <
                0x20) && ((object->copy_flags & 2U) != 0)) {
        next_copy_time = 0x20;
        length = 2;
      }
      else if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position <
                0x40) && ((object->copy_flags & 4U) != 0)) {
        next_copy_time = 0x40;
        length = 3;
      }
    }
    iVar1 = (time_now_local + next_copy_time) -
            (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position;
    if (iVar1 < next_copy_id) {
      next_copy_id = iVar1;
    }
    if ((((object->super_HorizontalRun).enqueues & 1U) == 0) || (next_copy_id <= time_now)) {
      Ball::output_pixels(object,this->collision_buffer_ + time_now_local,
                          next_copy_id - time_now_local,collision_identity,time_now_local + 0x40);
    }
    else if (time_now_local < time_now) {
      Ball::output_pixels(object,this->collision_buffer_ + time_now_local,time_now - time_now_local,
                          collision_identity,time_now_local + 0x40);
      HorizontalRun::enqueue_pixels
                (&object->super_HorizontalRun,time_now,next_copy_id,time_now + 0x40);
    }
    else {
      HorizontalRun::enqueue_pixels
                (&object->super_HorizontalRun,time_now_local,next_copy_id,time_now_local + 0x40);
    }
    (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position =
         ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position +
         (next_copy_id - time_now_local)) % 0xa0;
    time_now_local = next_copy_id;
    if ((((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving & 1U)
         == 0) || (next_copy_id != next_copy)) {
      if (next_copy_id == iVar1) {
        HorizontalRun::reset_pixels(&object->super_HorizontalRun,length);
      }
    }
    else {
      perform_motion_step<Atari2600::TIA::Ball>(this,object);
      next_copy = next_copy + 4;
    }
  }
  return;
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}